

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_KillObj(FParser *this)

{
  byte *pbVar1;
  AActor *target;
  FName local_c;
  DAngle local_8;
  
  if (this->t_argc == 0) {
    target = (this->Script->trigger).field_0.p;
    if (target == (AActor *)0x0) {
      return;
    }
    if (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      return;
    }
  }
  else {
    target = actorvalue(this->t_argv);
    if (target == (AActor *)0x0) {
      return;
    }
  }
  *(byte *)&(target->flags).Value = (byte)(target->flags).Value | 4;
  pbVar1 = (byte *)((long)&(target->flags2).Value + 3);
  *pbVar1 = *pbVar1 & 0xe7;
  local_c.Index = 0xc5;
  local_8.Degrees = 0.0;
  P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,target->health,&local_c,0,&local_8);
  return;
}

Assistant:

void FParser::SF_KillObj(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;  // default to trigger object
	}

	if(mo) 
	{
		// ensure the thing can be killed
		mo->flags|=MF_SHOOTABLE;
		mo->flags2&=~(MF2_INVULNERABLE|MF2_DORMANT);
		// [GrafZahl] This called P_KillMobj directly 
		// which is a very bad thing to do!
		P_DamageMobj(mo, NULL, NULL, mo->health, NAME_Massacre);
	}
}